

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall restincurl::RequestBuilder::SendFile(RequestBuilder *this,string *path)

{
  bool bVar1;
  int iVar2;
  Exception *this_00;
  pointer pRVar3;
  FILE *__stream;
  int *piVar4;
  SystemException *this_01;
  pointer pOVar5;
  __dev_t local_148;
  CURLoption local_13c;
  FILE *local_138;
  CURLoption local_130;
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [36];
  int local_e4;
  undefined1 local_e0 [4];
  int e;
  stat st;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *path_local;
  RequestBuilder *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x53a,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  bVar1 = CanSendFile(this);
  if (!bVar1) {
    __assert_fail("CanSendFile()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x53b,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  bVar1 = CanSendFile(this);
  if (!bVar1) {
    st.__glibc_reserved[2]._3_1_ = 1;
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Invalid curl operation for a file upload",&local_39);
    Exception::Exception(this_00,(string *)local_38);
    st.__glibc_reserved[2]._3_1_ = 0;
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    __assert_fail("request_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x540,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  pRVar3 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
           operator->(&this->request_);
  Request::OpenSourceFile(pRVar3,local_18);
  memset(local_e0,0,0x90);
  pRVar3 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
           operator->(&this->request_);
  __stream = (FILE *)Request::GetSourceFp(pRVar3);
  iVar2 = fileno(__stream);
  iVar2 = fstat(iVar2,(stat *)local_e0);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    local_e4 = *piVar4;
    local_12a = 1;
    this_01 = (SystemException *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Unable to stat file ",&local_129);
    std::operator+(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    SystemException::SystemException(this_01,local_108,local_e4);
    local_12a = 0;
    __cxa_throw(this_01,&SystemException::typeinfo,SystemException::~SystemException);
  }
  pOVar5 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_130 = CURLOPT_READDATA;
  pRVar3 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
           operator->(&this->request_);
  local_138 = Request::GetSourceFp(pRVar3);
  restincurl::Options::Set<_IO_FILE*>(pOVar5,&local_130,&local_138);
  pOVar5 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_13c = CURLOPT_INFILESIZE_LARGE;
  local_148 = st.st_rdev;
  restincurl::Options::Set<long>(pOVar5,&local_13c,(long *)&local_148);
  this->have_data_out_ = true;
  return this;
}

Assistant:

RequestBuilder& SendFile(const std::string& path) {
            assert(!is_built_);
            assert(CanSendFile());
            if (!CanSendFile()) {
                throw Exception{"Invalid curl operation for a file upload"};
            }

            assert(request_);
            request_->OpenSourceFile(path);
            struct stat st = {};
            if(fstat(fileno(request_->GetSourceFp()), &st) != 0) {
                const auto e = errno;
                throw SystemException{std::string{"Unable to stat file "} + path, e};
            }

            // set where to read from (on Windows you need to use READFUNCTION too)
            options_->Set(CURLOPT_READDATA, request_->GetSourceFp());
            options_->Set(CURLOPT_INFILESIZE_LARGE, static_cast<curl_off_t>(st.st_size));
            have_data_out_ = true;
            return *this;
        }